

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

string * __thiscall
iutest::detail::FileSystemFileTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,file_type *value)

{
  detail dVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  int local_c;
  
  dVar1 = *this;
  switch(dVar1) {
  case (detail)0x0:
    __s = "none";
    __a = &local_d;
    break;
  case (detail)0x1:
    __s = "regular";
    __a = &local_f;
    break;
  case (detail)0x2:
    __s = "directory";
    __a = &local_10;
    break;
  case (detail)0x3:
    __s = "symlink";
    __a = &local_11;
    break;
  case (detail)0x4:
    __s = "block";
    __a = &local_12;
    break;
  case (detail)0x5:
    __s = "character";
    __a = &local_13;
    break;
  case (detail)0x6:
    __s = "fifo";
    __a = &local_14;
    break;
  case (detail)0x7:
    __s = "socket";
    __a = &local_15;
    break;
  case (detail)0x8:
    __s = "unknown";
    __a = &local_16;
    break;
  default:
    if (dVar1 != (detail)0xff) {
      local_c = (int)(char)dVar1;
      PrintToString<int>(__return_storage_ptr__,&local_c);
      return __return_storage_ptr__;
    }
    __s = "not_found";
    __a = &local_e;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FileSystemFileTypeToString(const ::std::filesystem::file_type& value)
{
    switch(value)
    {
    IUTEST_PP_NAMESPACE_ENUM_CASE_RETURN_STRING(::std::filesystem::file_type, none);
    IUTEST_PP_NAMESPACE_ENUM_CASE_RETURN_STRING(::std::filesystem::file_type, not_found);
    IUTEST_PP_NAMESPACE_ENUM_CASE_RETURN_STRING(::std::filesystem::file_type, regular);
    IUTEST_PP_NAMESPACE_ENUM_CASE_RETURN_STRING(::std::filesystem::file_type, directory);
    IUTEST_PP_NAMESPACE_ENUM_CASE_RETURN_STRING(::std::filesystem::file_type, symlink);
    IUTEST_PP_NAMESPACE_ENUM_CASE_RETURN_STRING(::std::filesystem::file_type, block);
    IUTEST_PP_NAMESPACE_ENUM_CASE_RETURN_STRING(::std::filesystem::file_type, character);
    IUTEST_PP_NAMESPACE_ENUM_CASE_RETURN_STRING(::std::filesystem::file_type, fifo);
    IUTEST_PP_NAMESPACE_ENUM_CASE_RETURN_STRING(::std::filesystem::file_type, socket);
    IUTEST_PP_NAMESPACE_ENUM_CASE_RETURN_STRING(::std::filesystem::file_type, unknown);
#if defined(IUTEST_OS_WINDOWS) && !defined(IUTEST_OS_WINDOWS_MINGW)
    IUTEST_PP_NAMESPACE_ENUM_CASE_RETURN_STRING(::std::filesystem::file_type, junction);
#endif
    }
    return PrintToString(static_cast<int>(value));
}